

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

void __thiscall
CheckBox::CheckBox(CheckBox *this,string *buttonText,Color *textColor,uint charSize,float x,float y,
                  Color *buttonColor,Color *checkColor,bool startChecked)

{
  Text *this_00;
  RectangleShape *this_01;
  RectangleShape *this_02;
  Font *font;
  Transformable *this_03;
  float fVar1;
  FloatRect FVar2;
  locale local_58 [8];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19f0;
  this_03 = &(this->super_UIComponent).super_Transformable;
  sf::Transformable::Transformable(this_03);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__CheckBox_001d2228;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__CheckBox_001d2260;
  this_00 = &this->text;
  sf::Text::Text(this_00);
  this_01 = &this->button;
  local_50._0_4_ = 0.0;
  local_50._4_4_ = 0.0;
  sf::RectangleShape::RectangleShape(this_01,(Vector2f *)local_50);
  this_02 = &this->check;
  local_50._0_4_ = 0.0;
  local_50._4_4_ = 0.0;
  sf::RectangleShape::RectangleShape(this_02,(Vector2f *)local_50);
  sf::Color::Color(&this->checkColor);
  font = Board::getFont();
  sf::Text::setFont(this_00,font);
  std::locale::locale(local_58);
  sf::String::String((String *)local_50,buttonText,local_58);
  sf::Text::setString(this_00,(String *)local_50);
  if ((undefined1 *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_);
  }
  std::locale::~locale(local_58);
  sf::Text::setFillColor(this_00,textColor);
  sf::Text::setCharacterSize(this_00,charSize);
  fVar1 = (float)charSize * 1.5;
  sf::Transformable::setPosition(&(this->text).super_Transformable,fVar1 + 5.0,0.0);
  FVar2 = sf::Text::getLocalBounds(this_00);
  local_50._4_4_ = fVar1;
  local_50._0_4_ = FVar2.width + fVar1 + 10.0;
  sf::RectangleShape::setSize(this_01,(Vector2f *)local_50);
  sf::Shape::setFillColor(&this_01->super_Shape,buttonColor);
  sf::Transformable::setPosition(&(this->button).super_Shape.super_Transformable,0.0,0.0);
  local_50._4_4_ = fVar1 * 0.8;
  local_50._0_4_ = fVar1 * 0.8;
  sf::RectangleShape::setSize(this_02,(Vector2f *)local_50);
  if (startChecked) {
    buttonColor = checkColor;
  }
  sf::Shape::setFillColor(&this_02->super_Shape,buttonColor);
  sf::Shape::setOutlineColor(&this_02->super_Shape,(Color *)&sf::Color::Black);
  sf::Shape::setOutlineThickness(&this_02->super_Shape,-2.0);
  sf::Transformable::setPosition
            (&(this->check).super_Shape.super_Transformable,fVar1 * 0.2,fVar1 * 0.1);
  sf::Transformable::setPosition(this_03,x,y);
  this->checkColor = *checkColor;
  this->_checked = startChecked;
  return;
}

Assistant:

CheckBox::CheckBox(const string& buttonText, const Color& textColor, unsigned int charSize, float x, float y, const Color& buttonColor, const Color& checkColor, bool startChecked) {
    const float BUTTON_HEIGHT = charSize * 1.5f;
    text.setFont(Board::getFont());
    text.setString(buttonText);
    text.setFillColor(textColor);
    text.setCharacterSize(charSize);
    text.setPosition(BUTTON_HEIGHT + 5.0f, 0.0f);
    
    button.setSize(Vector2f(BUTTON_HEIGHT + text.getLocalBounds().width + 10.0f, BUTTON_HEIGHT));
    button.setFillColor(buttonColor);
    button.setPosition(0.0f, 0.0f);
    
    check.setSize(Vector2f(BUTTON_HEIGHT * 0.8f, BUTTON_HEIGHT * 0.8f));
    if (!startChecked) {
        check.setFillColor(buttonColor);
    } else {
        check.setFillColor(checkColor);
    }
    check.setOutlineColor(Color::Black);
    check.setOutlineThickness(-2.0f);
    check.setPosition(BUTTON_HEIGHT * 0.2f, BUTTON_HEIGHT * 0.1f);
    
    setPosition(x, y);
    this->checkColor = checkColor;
    _checked = startChecked;
}